

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O2

void __thiscall SortedRun::do_and(SortedRun *this,SortedRun *other)

{
  pointer puVar1;
  pointer puVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  IntersectionHelper helper;
  IntersectionHelper local_60;
  
  decompress(this);
  puVar1 = (other->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (other->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    iVar3 = begin(other);
    iVar4 = end(other);
    iVar5 = begin(this);
    iVar6 = end(this);
    iVar7 = begin(this);
    __first = std::
              __set_intersection<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (iVar3._M_current,iVar4._M_current,iVar5._M_current,iVar6._M_current,
                         iVar7._M_current);
  }
  else {
    local_60.prev_ = -1;
    local_60.seq_start_ =
         (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_60.seq_end_ =
         (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_60.run_it_ = puVar1;
    local_60.run_end_ = puVar2;
    local_60.seq_it_ = local_60.seq_start_;
    local_60.seq_out_ = local_60.seq_start_;
    IntersectionHelper::intersect(&local_60);
    iVar3 = begin(this);
    __first._M_current = ((long)local_60.seq_out_ - (long)local_60.seq_start_) + iVar3._M_current;
  }
  iVar3 = end(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            (&this->sequence_,(const_iterator)__first._M_current,(const_iterator)iVar3._M_current);
  return;
}

Assistant:

void SortedRun::do_and(SortedRun &other) {
    decompress();
    std::vector<uint32_t>::iterator new_end;
    if (other.is_compressed()) {
        IntersectionHelper helper(&sequence_, &other.run_);
        helper.intersect();
        new_end = begin() + helper.result_size();
    } else {
        new_end = std::set_intersection(other.begin(), other.end(), begin(),
                                        end(), begin());
    }
    sequence_.erase(new_end, end());
}